

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BytecodeTranslatorMain.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  BytecodeTranslator translator;
  string out;
  string in;
  exception e;
  ofstream ofs;
  
  op::initMap();
  in._M_dataplus._M_p = (pointer)&in.field_2;
  in._M_string_length = 0;
  out._M_dataplus._M_p = (pointer)&out.field_2;
  out._M_string_length = 0;
  in.field_2._M_local_buf[0] = '\0';
  out.field_2._M_local_buf[0] = '\0';
  if (argc == 3) {
    std::__cxx11::string::string((string *)&e,argv[1],(allocator *)&ofs);
    std::__cxx11::string::operator=((string *)&in,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::string((string *)&e,argv[2],(allocator *)&ofs);
    std::__cxx11::string::operator=((string *)&out,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
  }
  else {
    puts("Type input filename:");
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&in);
    puts("Type output filename:");
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&out);
  }
  std::ifstream::ifstream(&e,(string *)&in,_S_in);
  std::ofstream::ofstream(&ofs,(string *)&out,_S_out);
  BytecodeTranslator::translate(&translator,(ifstream *)&e,&ofs);
  std::ifstream::close();
  std::ofstream::close();
  std::ofstream::~ofstream(&ofs);
  std::ifstream::~ifstream(&e);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::~string((string *)&in);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
    try {
        op::initMap();
        std::string in, out;

        if (argc == 3) {
            in = std::string(argv[1]);
            out = std::string(argv[2]);
        } else {
            printf("Type input filename:\n");
            getline(std::cin, in);
            printf("Type output filename:\n");
            getline(std::cin, out);
        }
        std::ifstream ifs(in);
        std::ofstream ofs(out);
        BytecodeTranslator translator;
        translator.translate(ifs, ofs);
        ifs.close();
        ofs.close();
    } catch (std::exception e) {
        std::cout << e.what() << '\n';
    }
    return 0;
}